

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.h
# Opt level: O2

void __thiscall
Js::JavascriptPromiseReactionTaskFunction::JavascriptPromiseReactionTaskFunction
          (JavascriptPromiseReactionTaskFunction *this,DynamicType *type,FunctionInfo *functionInfo,
          JavascriptPromiseReaction *reaction,Var argument)

{
  RuntimeFunction::RuntimeFunction(&this->super_RuntimeFunction,type,functionInfo);
  (this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_013cbad0;
  Memory::WriteBarrierPtr<Js::JavascriptPromiseReaction>::WriteBarrierSet(&this->reaction,reaction);
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->argument,argument);
  return;
}

Assistant:

JavascriptPromiseReactionTaskFunction(DynamicType* type, FunctionInfo* functionInfo, JavascriptPromiseReaction* reaction, Var argument)
            : RuntimeFunction(type, functionInfo), reaction(reaction), argument(argument)
        { }